

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_runner.h
# Opt level: O2

void AssertEqual<std::__cxx11::string,char[6]>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,char (*u) [6],
               string *hint)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this;
  string local_1c0 [32];
  ostringstream os;
  
  bVar1 = std::operator!=(t,*u);
  if (!bVar1) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  poVar2 = std::operator<<((ostream *)&os,"Assertion failed: ");
  poVar2 = std::operator<<(poVar2,(string *)t);
  poVar2 = std::operator<<(poVar2," != ");
  poVar2 = std::operator<<(poVar2,*u);
  poVar2 = std::operator<<(poVar2," hint: ");
  std::operator<<(poVar2,(string *)hint);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1c0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AssertEqual(const T& t, const U& u, const string& hint) {
    if (t != u) {
        ostringstream os;
        os << "Assertion failed: " << t << " != " << u << " hint: " << hint;

        throw runtime_error(os.str());
    }
}